

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

void lj_snap_purge(jit_State *J)

{
  uint uVar1;
  long in_RDI;
  BCReg s;
  BCReg maxslot;
  uint8_t udf [255];
  uint local_110;
  char local_108 [60];
  BCReg in_stack_ffffffffffffff34;
  BCIns *in_stack_ffffffffffffff38;
  uint8_t *in_stack_ffffffffffffff40;
  jit_State *in_stack_ffffffffffffff48;
  
  uVar1 = *(uint *)(in_RDI + 0x8c);
  for (local_110 = snap_usedef(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                               in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
      local_110 < uVar1; local_110 = local_110 + 1) {
    if (local_108[local_110] != '\0') {
      *(undefined4 *)(*(long *)(in_RDI + 0x80) + (ulong)local_110 * 4) = 0;
    }
  }
  return;
}

Assistant:

void lj_snap_purge(jit_State *J)
{
  uint8_t udf[SNAP_USEDEF_SLOTS];
  BCReg maxslot = J->maxslot;
  BCReg s = snap_usedef(J, udf, J->pc, maxslot);
  for (; s < maxslot; s++)
    if (udf[s] != 0)
      J->base[s] = 0;  /* Purge dead slots. */
}